

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void Assimp::FlipWindingOrderProcess::ProcessMesh(aiMesh *pMesh)

{
  uint uVar1;
  aiAnimMesh *this;
  bool bVar2;
  aiFace *paVar3;
  uint local_50;
  uint local_4c;
  uint a_5;
  uint v;
  uint a_4;
  uint a_3;
  uint i;
  uint a_2;
  uint a_1;
  uint numVertices;
  aiAnimMesh *animMesh;
  uint m;
  uint b;
  aiFace *face;
  uint a;
  aiMesh *pMesh_local;
  
  for (face._4_4_ = 0; face._4_4_ < pMesh->mNumFaces; face._4_4_ = face._4_4_ + 1) {
    paVar3 = pMesh->mFaces + face._4_4_;
    for (animMesh._4_4_ = 0; animMesh._4_4_ < paVar3->mNumIndices >> 1;
        animMesh._4_4_ = animMesh._4_4_ + 1) {
      std::swap<unsigned_int>
                (paVar3->mIndices + animMesh._4_4_,
                 paVar3->mIndices + ((paVar3->mNumIndices - 1) - animMesh._4_4_));
    }
  }
  for (animMesh._0_4_ = 0; (uint)animMesh < pMesh->mNumAnimMeshes;
      animMesh._0_4_ = (uint)animMesh + 1) {
    this = pMesh->mAnimMeshes[(uint)animMesh];
    uVar1 = this->mNumVertices;
    bVar2 = aiAnimMesh::HasPositions(this);
    if (bVar2) {
      for (i = 0; i < uVar1; i = i + 1) {
        std::swap<aiVector3t<float>>(this->mVertices + i,this->mVertices + ((uVar1 - 1) - i));
      }
    }
    bVar2 = aiAnimMesh::HasNormals(this);
    if (bVar2) {
      for (a_3 = 0; a_3 < uVar1; a_3 = a_3 + 1) {
        std::swap<aiVector3t<float>>(this->mNormals + a_3,this->mNormals + ((uVar1 - 1) - a_3));
      }
    }
    for (a_4 = 0; a_4 < 8; a_4 = a_4 + 1) {
      bVar2 = aiAnimMesh::HasTextureCoords(this,a_4);
      if (bVar2) {
        for (v = 0; v < uVar1; v = v + 1) {
          std::swap<aiVector3t<float>>
                    (this->mTextureCoords[a_4] + v,this->mTextureCoords[a_4] + ((uVar1 - 1) - v));
        }
      }
    }
    bVar2 = aiAnimMesh::HasTangentsAndBitangents(this);
    if (bVar2) {
      for (a_5 = 0; a_5 < uVar1; a_5 = a_5 + 1) {
        std::swap<aiVector3t<float>>(this->mTangents + a_5,this->mTangents + ((uVar1 - 1) - a_5));
        std::swap<aiVector3t<float>>
                  (this->mBitangents + a_5,this->mBitangents + ((uVar1 - 1) - a_5));
      }
    }
    for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
      bVar2 = aiAnimMesh::HasVertexColors(this,local_4c);
      if (bVar2) {
        for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
          std::swap<aiColor4t<float>>
                    (this->mColors[local_4c] + local_50,
                     this->mColors[local_4c] + ((uVar1 - 1) - local_50));
        }
      }
    }
  }
  return;
}

Assistant:

void FlipWindingOrderProcess::ProcessMesh( aiMesh* pMesh)
{
    // invert the order of all faces in this mesh
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for (unsigned int b = 0; b < face.mNumIndices / 2; b++) {
            std::swap(face.mIndices[b], face.mIndices[face.mNumIndices - 1 - b]);
        }
    }

    // invert the order of all components in this mesh anim meshes
    for (unsigned int m = 0; m < pMesh->mNumAnimMeshes; m++) {
        aiAnimMesh* animMesh = pMesh->mAnimMeshes[m];
        unsigned int numVertices = animMesh->mNumVertices;
        if (animMesh->HasPositions()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mVertices[a], animMesh->mVertices[numVertices - 1 - a]);
            }
        }
        if (animMesh->HasNormals()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mNormals[a], animMesh->mNormals[numVertices - 1 - a]);
            }
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; i++) {
            if (animMesh->HasTextureCoords(i)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mTextureCoords[i][a], animMesh->mTextureCoords[i][numVertices - 1 - a]);
                }
            }
        }
        if (animMesh->HasTangentsAndBitangents()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mTangents[a], animMesh->mTangents[numVertices - 1 - a]);
                std::swap(animMesh->mBitangents[a], animMesh->mBitangents[numVertices - 1 - a]);
            }
        }
        for (unsigned int v = 0; v < AI_MAX_NUMBER_OF_COLOR_SETS; v++) {
            if (animMesh->HasVertexColors(v)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mColors[v][a], animMesh->mColors[v][numVertices - 1 - a]);
                }
            }
        }
    }
}